

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashedSimplePairCache.cpp
# Opt level: O3

btSimplePair * __thiscall
btHashedSimplePairCache::findPair(btHashedSimplePairCache *this,int indexA,int indexB)

{
  btSimplePair *pbVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  
  gFindSimplePairs = gFindSimplePairs + 1;
  uVar2 = indexB << 0x10 | indexA;
  uVar2 = ~(uVar2 << 0xf) + uVar2;
  uVar2 = ((int)uVar2 >> 10 ^ uVar2) * 9;
  uVar2 = (int)uVar2 >> 6 ^ uVar2;
  uVar2 = ~(uVar2 << 0xb) + uVar2;
  uVar3 = (long)(int)((int)uVar2 >> 0x10 ^ uVar2) &
          (long)(this->m_overlappingPairArray).m_capacity - 1U;
  if (((int)uVar3 < (this->m_hashTable).m_size) &&
     (iVar4 = (this->m_hashTable).m_data[uVar3], iVar4 != -1)) {
    pbVar1 = (this->m_overlappingPairArray).m_data;
    do {
      if ((pbVar1[iVar4].m_indexA == indexA) && (pbVar1[iVar4].m_indexB == indexB)) {
        return pbVar1 + iVar4;
      }
      iVar4 = (this->m_next).m_data[iVar4];
    } while (iVar4 != -1);
  }
  return (btSimplePair *)0x0;
}

Assistant:

btSimplePair* btHashedSimplePairCache::findPair(int indexA, int indexB)
{
	gFindSimplePairs++;
	
	
	/*if (indexA > indexB) 
		btSwap(indexA, indexB);*/

	int hash = static_cast<int>(getHash(static_cast<unsigned int>(indexA), static_cast<unsigned int>(indexB)) & (m_overlappingPairArray.capacity()-1));

	if (hash >= m_hashTable.size())
	{
		return NULL;
	}

	int index = m_hashTable[hash];
	while (index != BT_SIMPLE_NULL_PAIR && equalsPair(m_overlappingPairArray[index], indexA, indexB) == false)
	{
		index = m_next[index];
	}

	if (index == BT_SIMPLE_NULL_PAIR)
	{
		return NULL;
	}

	btAssert(index < m_overlappingPairArray.size());

	return &m_overlappingPairArray[index];
}